

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup.cpp
# Opt level: O0

int __thiscall QDnsLookup::qt_metacall(QDnsLookup *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  long in_FS_OFFSET;
  void **in_stack_00000050;
  int in_stack_00000058;
  Call in_stack_0000005c;
  QObject *in_stack_00000060;
  int local_28;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 8) {
        qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      }
      local_28 = local_28 + -8;
    }
    if (in_ESI == 7) {
      if (local_28 < 8) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      local_28 = local_28 + -8;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      local_28 = local_28 + -8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QDnsLookup::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 8)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 8;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    return _id;
}